

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

void __thiscall
google::protobuf::TextFormat::Printer::HardenedPrintString
          (Printer *this,string_view src,BaseTextGenerator *generator)

{
  size_t sVar1;
  bool bVar2;
  char *extraout_RDX;
  basic_string_view<char,_std::char_traits<char>_> bVar3;
  string_view sVar4;
  size_t local_88;
  char *local_80;
  string local_78 [32];
  string_view local_58;
  basic_string_view<char,_std::char_traits<char>_> local_48;
  BaseTextGenerator *local_38;
  size_t local_30;
  size_t local_28;
  size_t n;
  BaseTextGenerator *generator_local;
  string_view src_local;
  
  n = (size_t)src._M_str;
  src_local._M_len = src._M_len;
  generator_local = (BaseTextGenerator *)this;
  BaseTextGenerator::PrintLiteral<2ul>((BaseTextGenerator *)n,(char (*) [2])0x6584e2);
  while( true ) {
    bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                      ((basic_string_view<char,_std::char_traits<char>_> *)&generator_local);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    local_38 = generator_local;
    local_30 = src_local._M_len;
    sVar4._M_str = extraout_RDX;
    sVar4._M_len = src_local._M_len;
    local_28 = anon_unknown_1::SkipPassthroughBytes((anon_unknown_1 *)generator_local,sVar4);
    sVar1 = n;
    if (local_28 != 0) {
      local_48 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                           ((basic_string_view<char,_std::char_traits<char>_> *)&generator_local,0,
                            local_28);
      BaseTextGenerator::PrintString((BaseTextGenerator *)sVar1,local_48);
      std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix
                ((basic_string_view<char,_std::char_traits<char>_> *)&generator_local,local_28);
      bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                        ((basic_string_view<char,_std::char_traits<char>_> *)&generator_local);
      if (bVar2) break;
    }
    sVar1 = n;
    bVar3 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                      ((basic_string_view<char,_std::char_traits<char>_> *)&generator_local,0,1);
    local_88 = bVar3._M_len;
    local_80 = bVar3._M_str;
    absl::lts_20240722::CEscape_abi_cxx11_(local_78,local_88,local_80);
    sVar4 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view(local_78);
    local_58 = sVar4;
    BaseTextGenerator::PrintString((BaseTextGenerator *)sVar1,sVar4);
    std::__cxx11::string::~string(local_78);
    std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix
              ((basic_string_view<char,_std::char_traits<char>_> *)&generator_local,1);
  }
  BaseTextGenerator::PrintLiteral<2ul>((BaseTextGenerator *)n,(char (*) [2])0x6584e2);
  return;
}

Assistant:

void TextFormat::Printer::HardenedPrintString(
    absl::string_view src, TextFormat::BaseTextGenerator* generator) {
  // Print as UTF-8, while guarding against any invalid UTF-8 in the string
  // field.
  //
  // If in the future we have a guaranteed invariant that invalid UTF-8 will
  // never be present, we could avoid the UTF-8 check here.

  generator->PrintLiteral("\"");
  while (!src.empty()) {
    size_t n = SkipPassthroughBytes(src);
    if (n != 0) {
      generator->PrintString(src.substr(0, n));
      src.remove_prefix(n);
      if (src.empty()) break;
    }

    // If repeated calls to CEscape() and PrintString() are expensive, we could
    // consider batching them, at the cost of some complexity.
    generator->PrintString(absl::CEscape(src.substr(0, 1)));
    src.remove_prefix(1);
  }
  generator->PrintLiteral("\"");
}